

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  complex<double> *pcVar1;
  long lVar2;
  complex<double> *pcVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long lVar7;
  complex<double> *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar2 = sourceindex->fNElements;
  lVar13 = 0;
  lVar7 = 0;
  if (0 < lVar2) {
    lVar7 = lVar2;
  }
  for (; lVar13 != lVar7; lVar13 = lVar13 + 1) {
    iVar6 = Local(this,destinationindex->fStore[lVar13]);
    lVar12 = (long)iVar6;
    for (lVar11 = lVar13; lVar2 != lVar11; lVar11 = lVar11 + 1) {
      iVar6 = Local(this,destinationindex->fStore[lVar11]);
      lVar10 = (long)iVar6;
      pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                         (elmat,sourceindex->fStore[lVar13],sourceindex->fStore[lVar11]);
      lVar9 = lVar10;
      if (lVar10 < lVar12) {
        lVar9 = lVar12;
      }
      if (lVar12 < lVar10) {
        lVar10 = lVar12;
      }
      lVar9 = ((lVar9 + 1) * lVar9) / 2;
      pcVar3 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
      dVar4 = *(double *)(pcVar8->_M_value + 8);
      pcVar1 = pcVar3 + lVar9 + lVar10;
      dVar5 = *(double *)(pcVar1->_M_value + 8);
      pcVar3 = pcVar3 + lVar9 + lVar10;
      *(double *)pcVar3->_M_value = *(double *)pcVar1->_M_value + *(double *)pcVar8->_M_value;
      *(double *)(pcVar3->_M_value + 8) = dVar5 + dVar4;
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = i; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}